

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update_extensions.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
__thiscall
duckdb::PhysicalUpdateExtensions::GetGlobalSourceState
          (PhysicalUpdateExtensions *this,ClientContext *context)

{
  pointer pbVar1;
  pointer pUVar2;
  pointer pUVar3;
  ClientContext *in_RDX;
  pointer *__ptr;
  profiler_settings_t *this_00;
  pointer extension_name;
  unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
  local_e8;
  __uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
  local_e0;
  ExtensionUpdateResult local_d8;
  
  local_e0._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
  .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>)
       (tuple<duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>)this;
  make_uniq<duckdb::UpdateExtensionsGlobalState>();
  this_00 = &(context->config).profiler_settings;
  pUVar2 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
           ::operator->((unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                         *)this_00);
  if ((pUVar2->extensions_to_update).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pUVar2->extensions_to_update).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ExtensionHelper::UpdateExtensions
              ((vector<duckdb::ExtensionUpdateResult,_true> *)&local_d8,in_RDX);
    pUVar3 = unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
             ::operator->(&local_e8);
    ::std::vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
    _M_move_assign(&(pUVar3->update_result_entries).
                    super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
                   ,&local_d8);
    ::std::vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
    ~vector((vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_> *
            )&local_d8);
  }
  else {
    pUVar2 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
             ::operator->((unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                           *)this_00);
    pbVar1 = (pUVar2->extensions_to_update).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (extension_name =
              (pUVar2->extensions_to_update).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; extension_name != pbVar1;
        extension_name = extension_name + 1) {
      pUVar3 = unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
               ::operator->(&local_e8);
      ExtensionHelper::UpdateExtension(&local_d8,in_RDX,extension_name);
      ::std::vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
      emplace_back<duckdb::ExtensionUpdateResult>
                (&(pUVar3->update_result_entries).
                  super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
                 ,&local_d8);
      ExtensionUpdateResult::~ExtensionUpdateResult(&local_d8);
    }
  }
  *(unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>_>
    *)local_e0._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
      .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl =
       local_e8.
       super_unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UpdateExtensionsGlobalState_*,_std::default_delete<duckdb::UpdateExtensionsGlobalState>_>
       .super__Head_base<0UL,_duckdb::UpdateExtensionsGlobalState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
          )local_e0._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
           .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalSourceState> PhysicalUpdateExtensions::GetGlobalSourceState(ClientContext &context) const {
	auto res = make_uniq<UpdateExtensionsGlobalState>();

	if (info->extensions_to_update.empty()) {
		// Update all
		res->update_result_entries = ExtensionHelper::UpdateExtensions(context);
	} else {
		// Update extensions in extensions_to_update
		for (const auto &ext : info->extensions_to_update) {
			res->update_result_entries.emplace_back(ExtensionHelper::UpdateExtension(context, ext));
		}
	}

	return std::move(res);
}